

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O2

VariableIndex __thiscall
cnn::ComputationGraph::add_input
          (ComputationGraph *this,Dim *d,vector<float,_std::allocator<float>_> *pm)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  undefined8 in_RCX;
  Node *local_28;
  
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)(*(long *)(d->d + 2) - *(long *)d->d) >> 3);
  local_28 = (Node *)operator_new(0x98);
  (local_28->dim).nd = 0;
  (local_28->dim).bd = 1;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28->_vptr_Node = (_func_int **)&PTR__InputNode_003a60f8;
  pVVar1 = (pointer)(pm->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
  pVVar2 = (pointer)(pm->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
  pVVar3 = (pointer)pm[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_28[1]._vptr_Node =
       (_func_int **)
       (pm->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = pVVar1;
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pVVar3;
  local_28[1].dim.d[0] =
       *(uint *)&pm[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  *(undefined8 *)(local_28[1].dim.d + 6) = 0;
  local_28[1].dim.d[2] = 0;
  local_28[1].dim.d[3] = 0;
  local_28[1].dim.d[4] = 0;
  local_28[1].dim.d[5] = 0;
  *(undefined8 *)&local_28[1].dim.bd = in_RCX;
  std::vector<cnn::Node*,std::allocator<cnn::Node*>>::emplace_back<cnn::Node*>
            ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)d,&local_28);
  set_dim_for_new_node((ComputationGraph *)d,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

VariableIndex ComputationGraph::add_input(const Dim& d, const vector<float>* pm) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new InputNode(d, pm));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}